

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

void DispatchAlphaToGreen_SSE2
               (uint8_t *alpha,int alpha_stride,int width,int height,uint32_t *dst,int dst_stride)

{
  ulong uVar1;
  ulong uVar2;
  ulong *puVar3;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  __m128i zero;
  int j;
  int i;
  int local_194;
  int local_190;
  long local_188;
  long local_170;
  byte local_158;
  undefined1 uStack_157;
  byte bStack_156;
  byte bStack_154;
  undefined1 uStack_153;
  byte bStack_152;
  byte bStack_120;
  undefined1 uStack_11f;
  byte bStack_11e;
  byte bStack_11c;
  undefined1 uStack_11b;
  byte bStack_11a;
  __m128i b2_hi;
  __m128i a2_hi;
  __m128i b2_lo;
  __m128i a2_lo;
  __m128i b1;
  __m128i a1;
  __m128i a0;
  ushort uStack_10;
  undefined2 uStack_e;
  ushort uStack_c;
  int limit;
  
  local_188 = in_R8;
  local_170 = in_RDI;
  for (local_194 = 0; local_194 < in_ECX; local_194 = local_194 + 1) {
    for (local_190 = 0; local_190 < (int)(in_EDX & 0xfffffff0); local_190 = local_190 + 0x10) {
      uVar1 = *(ulong *)(local_170 + local_190);
      uVar2 = ((ulong *)(local_170 + local_190))[1];
      local_158 = (byte)uVar1;
      uStack_157 = (undefined1)(uVar1 >> 8);
      bStack_156 = (byte)(uVar1 >> 0x10);
      bStack_154 = (byte)(uVar1 >> 0x20);
      uStack_153 = (undefined1)(uVar1 >> 0x28);
      bStack_152 = (byte)(uVar1 >> 0x30);
      bStack_120 = (byte)uVar2;
      uStack_11f = (undefined1)(uVar2 >> 8);
      bStack_11e = (byte)(uVar2 >> 0x10);
      bStack_11c = (byte)(uVar2 >> 0x20);
      uStack_11b = (undefined1)(uVar2 >> 0x28);
      bStack_11a = (byte)(uVar2 >> 0x30);
      b2_lo[1]._0_2_ = (ushort)((uint3)local_158 << 8);
      b2_lo[1]._2_2_ = (undefined2)(CONCAT13(uStack_157,(uint3)local_158 << 8) >> 0x10);
      b2_lo[1]._4_2_ = (ushort)(((uint6)bStack_156 << 0x28) >> 0x20);
      b2_lo[1]._6_2_ = (undefined2)(((uVar1 >> 0x18) << 0x38) >> 0x30);
      b2_hi[1]._0_2_ = (ushort)((uint3)bStack_120 << 8);
      b2_hi[1]._2_2_ = (undefined2)(CONCAT13(uStack_11f,(uint3)bStack_120 << 8) >> 0x10);
      b2_hi[1]._4_2_ = (ushort)(((uint6)bStack_11e << 0x28) >> 0x20);
      b2_hi[1]._6_2_ = (undefined2)(((uVar2 >> 0x18) << 0x38) >> 0x30);
      uStack_10 = (ushort)((uint3)bStack_154 << 8);
      uStack_e = (undefined2)(CONCAT13(uStack_153,(uint3)bStack_154 << 8) >> 0x10);
      uStack_c = (ushort)(((uint6)bStack_152 << 0x28) >> 0x20);
      a1[0]._0_2_ = (ushort)((uint3)bStack_11c << 8);
      a1[0]._2_2_ = (undefined2)(CONCAT13(uStack_11b,(uint3)bStack_11c << 8) >> 0x10);
      a1[0]._4_2_ = (ushort)(((uint6)bStack_11a << 0x28) >> 0x20);
      puVar3 = (ulong *)(local_188 + (long)local_190 * 4);
      *puVar3 = (ulong)CONCAT24(b2_lo[1]._2_2_,(uint)(ushort)b2_lo[1]);
      puVar3[1] = (ulong)CONCAT24(b2_lo[1]._6_2_,(uint)b2_lo[1]._4_2_);
      puVar3 = (ulong *)(local_188 + (long)(local_190 + 4) * 4);
      *puVar3 = (ulong)CONCAT24(uStack_e,(uint)uStack_10);
      puVar3[1] = (ulong)(CONCAT24((short)(uVar1 >> 0x30),(uint)uStack_c) & 0xff00ffffffff);
      puVar3 = (ulong *)(local_188 + (long)(local_190 + 8) * 4);
      *puVar3 = (ulong)CONCAT24(b2_hi[1]._2_2_,(uint)(ushort)b2_hi[1]);
      puVar3[1] = (ulong)CONCAT24(b2_hi[1]._6_2_,(uint)b2_hi[1]._4_2_);
      puVar3 = (ulong *)(local_188 + (long)(local_190 + 0xc) * 4);
      *puVar3 = (ulong)CONCAT24(a1[0]._2_2_,(uint)(ushort)a1[0]);
      puVar3[1] = (ulong)(CONCAT24((short)(uVar2 >> 0x30),(uint)a1[0]._4_2_) & 0xff00ffffffff);
    }
    for (; local_190 < (int)in_EDX; local_190 = local_190 + 1) {
      *(uint *)(local_188 + (long)local_190 * 4) = (uint)*(byte *)(local_170 + local_190) << 8;
    }
    local_170 = local_170 + in_ESI;
    local_188 = local_188 + (long)in_R9D * 4;
  }
  return;
}

Assistant:

static void DispatchAlphaToGreen_SSE2(const uint8_t* WEBP_RESTRICT alpha,
                                      int alpha_stride, int width, int height,
                                      uint32_t* WEBP_RESTRICT dst,
                                      int dst_stride) {
  int i, j;
  const __m128i zero = _mm_setzero_si128();
  const int limit = width & ~15;
  for (j = 0; j < height; ++j) {
    for (i = 0; i < limit; i += 16) {   // process 16 alpha bytes
      const __m128i a0 = _mm_loadu_si128((const __m128i*)&alpha[i]);
      const __m128i a1 = _mm_unpacklo_epi8(zero, a0);  // note the 'zero' first!
      const __m128i b1 = _mm_unpackhi_epi8(zero, a0);
      const __m128i a2_lo = _mm_unpacklo_epi16(a1, zero);
      const __m128i b2_lo = _mm_unpacklo_epi16(b1, zero);
      const __m128i a2_hi = _mm_unpackhi_epi16(a1, zero);
      const __m128i b2_hi = _mm_unpackhi_epi16(b1, zero);
      _mm_storeu_si128((__m128i*)&dst[i +  0], a2_lo);
      _mm_storeu_si128((__m128i*)&dst[i +  4], a2_hi);
      _mm_storeu_si128((__m128i*)&dst[i +  8], b2_lo);
      _mm_storeu_si128((__m128i*)&dst[i + 12], b2_hi);
    }
    for (; i < width; ++i) dst[i] = alpha[i] << 8;
    alpha += alpha_stride;
    dst += dst_stride;
  }
}